

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_from_signed62(secp256k1_scalar *r,secp256k1_modinv64_signed62 *a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar12;
  secp256k1_modinv64_signed62 *in_RCX;
  secp256k1_modinv64_signed62 *psVar13;
  ulong *extraout_RDX;
  int64_t *a_00;
  long lVar14;
  long lVar15;
  int64_t *a_01;
  long lVar16;
  int64_t *piVar17;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_02;
  long *extraout_RDX_09;
  long lVar18;
  long lVar19;
  secp256k1_modinv64_signed62 *b;
  int64_t *piVar20;
  ulong uVar21;
  long lVar22;
  int64_t *piVar23;
  secp256k1_modinv64_signed62 *psVar24;
  int64_t *piVar25;
  undefined1 *puVar26;
  secp256k1_modinv64_signed62 *psVar27;
  int64_t *piVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  secp256k1_modinv64_signed62 *psVar32;
  bool bVar33;
  secp256k1_modinv64_signed62 sStack_118;
  secp256k1_modinv64_signed62 sStack_f0;
  int64_t *piStack_c8;
  int64_t *piStack_c0;
  secp256k1_modinv64_signed62 *psStack_b8;
  ulong uStack_b0;
  int64_t *piStack_a8;
  ulong uStack_a0;
  int64_t *piStack_98;
  secp256k1_modinv64_signed62 *psStack_90;
  int64_t *piStack_88;
  long lStack_80;
  long lStack_78;
  int64_t *piStack_70;
  long lStack_68;
  long lStack_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  int64_t *piStack_40;
  
  piVar20 = a->v;
  if ((ulong)*piVar20 >> 0x3e == 0) {
    uVar21 = a->v[1];
    if (0x3fffffffffffffff < uVar21) goto LAB_00141e55;
    in_RCX = (secp256k1_modinv64_signed62 *)a->v[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < in_RCX) goto LAB_00141e5a;
    uVar8 = a->v[3];
    if (0x3fffffffffffffff < uVar8) goto LAB_00141e5f;
    a = (secp256k1_modinv64_signed62 *)a->v[4];
    if (a < (secp256k1_modinv64_signed62 *)&DAT_00000100) {
      r->d[0] = uVar21 << 0x3e | *piVar20;
      r->d[1] = (long)in_RCX << 0x3c | uVar21 >> 2;
      r->d[2] = uVar8 << 0x3a | (ulong)in_RCX >> 4;
      r->d[3] = (long)a << 0x38 | uVar8 >> 6;
      secp256k1_scalar_verify(r);
      return;
    }
  }
  else {
    secp256k1_scalar_from_signed62_cold_5();
LAB_00141e55:
    secp256k1_scalar_from_signed62_cold_4();
LAB_00141e5a:
    secp256k1_scalar_from_signed62_cold_3();
LAB_00141e5f:
    secp256k1_scalar_from_signed62_cold_2();
  }
  secp256k1_scalar_from_signed62_cold_1();
  lVar16 = *(long *)r;
  lStack_58 = *(long *)((long)r + 8);
  lStack_60 = *(long *)((long)r + 0x10);
  lStack_68 = *(long *)((long)r + 0x18);
  lStack_78 = *(long *)((long)r + 0x20);
  lVar15 = a->v[0];
  piStack_40 = *(int64_t **)((long)a + 8);
  lVar14 = *(long *)((long)a + 0x10);
  uStack_a0 = *extraout_RDX;
  piStack_98 = (int64_t *)extraout_RDX[1];
  uStack_b0 = extraout_RDX[2];
  piStack_a8 = (int64_t *)extraout_RDX[3];
  lStack_48 = *(long *)((long)a + 0x18);
  lStack_80 = *(long *)((long)a + 0x20);
  uVar21 = 5;
  psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_b8 = (secp256k1_modinv64_signed62 *)0x141eff;
  a_00 = (int64_t *)r;
  iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
  piVar20 = a->v;
  if (iVar4 < 1) {
LAB_001429a4:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429a9;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_001429a9:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429ae;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_001429ae:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429b3;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_001429b3:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429b8;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_001429b8:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429bd;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar32 = in_RCX;
LAB_001429bd:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429c2;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_001429c2:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429c7;
    secp256k1_modinv64_update_de_62_cold_1();
    in_RCX = psVar32;
LAB_001429c7:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429cc;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_001429cc:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429d1;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001429d1:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429d6;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_001429d6:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429db;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001429db:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429e0;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001429e0:
    a_01 = a_00;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429e5;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001429e5:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429ea;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001429ea:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429ef;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001429ef:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429f4;
    secp256k1_modinv64_update_de_62_cold_9();
    a_00 = a_01;
LAB_001429f4:
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429f9;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    uVar21 = 5;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141f21;
    a_00 = (int64_t *)r;
    piStack_70 = (int64_t *)r;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
    if (-1 < iVar4) goto LAB_001429a9;
    uVar21 = 5;
    psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141f40;
    a_00 = a->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
    if (iVar4 < 1) goto LAB_001429ae;
    psVar13 = (secp256k1_modinv64_signed62 *)0x1;
    uVar21 = 5;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141f5d;
    a_00 = a->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
    if (-1 < iVar4) goto LAB_001429b3;
    piVar20 = (int64_t *)0x3fffffffffffffff;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141f83;
    piStack_88 = a->v;
    lStack_50 = lVar14;
    iVar6 = secp256k1_modinv64_abs(uStack_a0);
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141f90;
    a_00 = piStack_98;
    iVar7 = secp256k1_modinv64_abs((int64_t)piStack_98);
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    if ((long)psVar13 < iVar6) goto LAB_001429b8;
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141fab;
    iVar6 = secp256k1_modinv64_abs(uStack_b0);
    psStack_b8 = (secp256k1_modinv64_signed62 *)0x141fb8;
    a_00 = piStack_a8;
    iVar7 = secp256k1_modinv64_abs((int64_t)piStack_a8);
    psVar13 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    psVar32 = in_RCX;
    if ((long)psVar13 < iVar6) goto LAB_001429bd;
    uVar21 = uStack_a0 * lVar16;
    psVar13 = SUB168(SEXT816((long)uStack_a0) * SEXT816(lVar16),8);
    uVar8 = (long)piStack_98 * lVar15;
    a_00 = SUB168(SEXT816((long)piStack_98) * SEXT816(lVar15),8);
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    lVar14 = (0x7fffffffffffffff - (long)a_00) - (long)psVar13;
    if ((SBORROW8(0x7fffffffffffffff - (long)a_00,(long)psVar13) !=
        SBORROW8(lVar14,(ulong)(~uVar8 < uVar21))) != (long)(lVar14 - (ulong)(~uVar8 < uVar21)) < 0
        && -1 < (long)a_00) goto LAB_001429f4;
    piVar23 = (int64_t *)(uVar8 + uVar21);
    a_00 = (int64_t *)((long)a_00 + (long)psVar13 + (ulong)CARRY8(uVar8,uVar21));
    uVar9 = uStack_b0 * lVar16;
    lVar14 = SUB168(SEXT816((long)uStack_b0) * SEXT816(lVar16),8);
    uVar10 = (long)piStack_a8 * lVar15;
    lVar15 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lVar15),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar9);
    lVar16 = (0x7fffffffffffffff - lVar15) - lVar14;
    bVar33 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar14) != SBORROW8(lVar16,uVar8)) !=
             (long)(lVar16 - uVar8) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)(-uVar10 - 1 >> 8),bVar33 && -1 < lVar15);
    if (!bVar33 || -1 >= lVar15) {
      psVar32 = (secp256k1_modinv64_signed62 *)(lStack_78 >> 0x3f);
      psVar13 = (secp256k1_modinv64_signed62 *)(lStack_80 >> 0x3f);
      lVar22 = ((ulong)piStack_98 & (ulong)psVar13) + (uStack_a0 & (ulong)psVar32);
      piVar25 = (int64_t *)(uVar10 + uVar9);
      lVar15 = lVar15 + lVar14 + (ulong)CARRY8(uVar10,uVar9);
      lVar16 = in_RCX->v[0];
      uVar8 = in_RCX[1].v[0];
      uVar21 = lVar22 - (uVar8 * (long)piVar23 + lVar22 & 0x3fffffffffffffff);
      piVar11 = (int64_t *)(uVar21 * lVar16);
      a_01 = SUB168(SEXT816((long)uVar21) * SEXT816(lVar16),8);
      psStack_90 = in_RCX;
      if (-1 < (long)a_01) {
        uVar9 = (ulong)((undefined1 *)(-(long)piVar11 - 1U) < piVar23);
        lVar14 = (0x7fffffffffffffff - (long)a_01) - (long)a_00;
        if ((SBORROW8(0x7fffffffffffffff - (long)a_01,(long)a_00) != SBORROW8(lVar14,uVar9)) ==
            (long)(lVar14 - uVar9) < 0) goto LAB_001420e6;
LAB_001422a7:
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x1422ac;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_001422ac:
        lVar22 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
        lVar14 = lVar15 - lVar22;
        if ((SBORROW8(lVar15,lVar22) !=
            SBORROW8(lVar14,(ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
            (long)(lVar14 - (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0)
        goto LAB_00142136;
LAB_001422ce:
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x1422d3;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar9 = extraout_RAX;
        lVar15 = extraout_RDX_00;
LAB_001422d3:
        psVar32 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - lVar15) - (ulong)(uVar9 != 0));
        a_00 = (int64_t *)
               (((long)piVar23 - (long)psVar32) -
               (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar9));
        if ((SBORROW8((long)piVar23,(long)psVar32) !=
            SBORROW8((long)piVar23 - (long)psVar32,
                     (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar9))) == (long)a_00 < 0) {
LAB_001421b9:
          uVar8 = uVar8 >> 0x3e | lVar16 << 2;
          bVar33 = CARRY8((ulong)piVar25,uVar9);
          piVar25 = (int64_t *)((long)piVar25 + uVar9);
          piVar23 = (int64_t *)((long)piVar23 + (ulong)bVar33 + lVar15);
          psVar32 = (secp256k1_modinv64_signed62 *)(uStack_b0 * lStack_58 + uVar8);
          a_00 = (int64_t *)
                 (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_58),8) + (lVar16 >> 0x3e) +
                 (ulong)CARRY8(uStack_b0 * lStack_58,uVar8));
          uVar8 = (long)piStack_a8 * (long)a_01;
          lVar16 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)a_01),8);
          if (lVar16 < 0) goto LAB_001422fd;
          uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar32);
          lVar15 = (0x7fffffffffffffff - lVar16) - (long)a_00;
          in_RCX = (secp256k1_modinv64_signed62 *)(lVar15 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar16,(long)a_00) != SBORROW8(lVar15,uVar9)) !=
              (long)in_RCX < 0) goto LAB_00142315;
        }
        else {
LAB_001422f8:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x1422fd;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar8 = extraout_RAX_00;
          lVar16 = extraout_RDX_01;
LAB_001422fd:
          in_RCX = (secp256k1_modinv64_signed62 *)
                   ((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
          if ((SBORROW8((long)a_00,(long)in_RCX) !=
              SBORROW8((long)a_00 - (long)in_RCX,
                       (ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
              (long)(((long)a_00 - (long)in_RCX) -
                    (ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0) {
LAB_00142315:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x14231a;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00142320;
          }
        }
        bVar33 = CARRY8((ulong)psVar32,uVar8);
        psVar32 = (secp256k1_modinv64_signed62 *)((long)psVar32->v + uVar8);
        a_00 = (int64_t *)((long)a_00 + (ulong)bVar33 + lVar16);
        psVar27 = (secp256k1_modinv64_signed62 *)psStack_90->v[1];
        in_RCX = psStack_90;
        if (psVar27 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00142320;
        piVar11 = (int64_t *)((long)psVar27 * uVar21);
        piVar17 = SUB168(SEXT816((long)psVar27) * SEXT816((long)uVar21),8);
        if ((long)piVar17 < 0) goto LAB_001428ba;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar11 - 1U) < piVar25);
        lVar16 = (0x7fffffffffffffff - (long)piVar17) - (long)piVar23;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar17,(long)piVar23) != SBORROW8(lVar16,uVar8))
            != (long)(lVar16 - uVar8) < 0) goto LAB_001428dc;
LAB_00142253:
        bVar33 = CARRY8((ulong)piVar11,(ulong)piVar25);
        piVar11 = (int64_t *)((long)piVar11 + (long)piVar25);
        piVar17 = (int64_t *)((long)piVar17 + (long)piVar23 + (ulong)bVar33);
        uVar8 = (long)psVar27 * (long)psVar13;
        lVar16 = SUB168(SEXT816((long)psVar27) * SEXT816((long)psVar13),8);
        if (lVar16 < 0) goto LAB_001428e1;
        psVar24 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
        lVar15 = ((long)r - lVar16) - (long)a_00;
        puVar26 = (undefined1 *)(lVar15 - (ulong)(psVar24 < psVar32));
        if ((SBORROW8((long)r - lVar16,(long)a_00) != SBORROW8(lVar15,(ulong)(psVar24 < psVar32)))
            != (long)puVar26 < 0) goto LAB_00142903;
LAB_00142284:
        bVar33 = CARRY8((ulong)psVar32,uVar8);
        psVar32 = (secp256k1_modinv64_signed62 *)((long)psVar32->v + uVar8);
        a_00 = (int64_t *)((long)a_00 + (ulong)bVar33 + lVar16);
        piVar23 = piVar17;
        piVar25 = piVar11;
LAB_00142320:
        piVar17 = piStack_70;
        uVar8 = (long)piVar23 << 2 | (ulong)piVar25 >> 0x3e;
        a_01 = (int64_t *)(uStack_a0 * lStack_60 + uVar8);
        psVar27 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_60),8) + ((long)piVar23 >> 0x3e)
                  + (ulong)CARRY8(uStack_a0 * lStack_60,uVar8));
        *piStack_70 = (ulong)piVar25 & 0x3fffffffffffffff;
        uVar8 = (long)piStack_98 * lStack_50;
        lVar16 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_50),8);
        *piStack_88 = (ulong)psVar32 & 0x3fffffffffffffff;
        if (lVar16 < 0) {
          puVar26 = (undefined1 *)((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
          psVar24 = (secp256k1_modinv64_signed62 *)
                    (((long)psVar27 - (long)puVar26) -
                    (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-uVar8));
          if ((SBORROW8((long)psVar27,(long)puVar26) !=
              SBORROW8((long)psVar27 - (long)puVar26,
                       (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-uVar8))) != (long)psVar24 < 0)
          goto LAB_0014247e;
LAB_0014238e:
          uVar9 = (ulong)psVar32 >> 0x3e | (long)a_00 << 2;
          bVar33 = CARRY8((ulong)a_01,uVar8);
          a_01 = (int64_t *)((long)a_01 + uVar8);
          psVar27 = (secp256k1_modinv64_signed62 *)((long)psVar27->v + (ulong)bVar33 + lVar16);
          puVar26 = (undefined1 *)(uStack_b0 * lStack_60 + uVar9);
          psVar24 = (secp256k1_modinv64_signed62 *)
                    (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_60),8) + ((long)a_00 >> 0x3e)
                    + (ulong)CARRY8(uStack_b0 * lStack_60,uVar9));
          uVar8 = (long)piStack_a8 * lStack_50;
          lVar16 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_50),8);
          if (lVar16 < 0) goto LAB_00142483;
          uVar9 = (ulong)((undefined1 *)(-1 - uVar8) < puVar26);
          lVar15 = ((long)r - lVar16) - (long)psVar24;
          if ((SBORROW8((long)r - lVar16,(long)psVar24) != SBORROW8(lVar15,uVar9)) !=
              (long)(lVar15 - uVar9) < 0) goto LAB_001424a5;
        }
        else {
          psVar24 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
          lVar15 = ((long)r - lVar16) - (long)psVar27;
          puVar26 = (undefined1 *)(lVar15 - (ulong)(psVar24 < a_01));
          if ((SBORROW8((long)r - lVar16,(long)psVar27) != SBORROW8(lVar15,(ulong)(psVar24 < a_01)))
              == (long)puVar26 < 0) goto LAB_0014238e;
LAB_0014247e:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x142483;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar8 = extraout_RAX_01;
          lVar16 = extraout_RDX_02;
LAB_00142483:
          lVar14 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
          lVar15 = (long)psVar24 - lVar14;
          if ((SBORROW8((long)psVar24,lVar14) !=
              SBORROW8(lVar15,(ulong)(puVar26 < (undefined1 *)-uVar8))) !=
              (long)(lVar15 - (ulong)(puVar26 < (undefined1 *)-uVar8)) < 0) {
LAB_001424a5:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1424aa;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_001424b0;
          }
        }
        bVar33 = CARRY8((ulong)puVar26,uVar8);
        puVar26 = puVar26 + uVar8;
        psVar24 = (secp256k1_modinv64_signed62 *)((long)psVar24->v + (ulong)bVar33 + lVar16);
        piVar11 = (int64_t *)in_RCX->v[2];
        if (piVar11 == (int64_t *)0x0) goto LAB_001424b0;
        a_00 = (int64_t *)((long)piVar11 * uVar21);
        psVar32 = SUB168(SEXT816((long)piVar11) * SEXT816((long)uVar21),8);
        if ((long)psVar32 < 0) goto LAB_00142908;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a_00 - 1U) < a_01);
        lVar16 = ((long)r - (long)psVar32) - (long)psVar27;
        piVar23 = a_01;
        if ((SBORROW8((long)r - (long)psVar32,(long)psVar27) != SBORROW8(lVar16,uVar8)) !=
            (long)(lVar16 - uVar8) < 0) goto LAB_0014292a;
LAB_00142423:
        bVar33 = CARRY8((ulong)a_00,(ulong)piVar23);
        a_00 = (int64_t *)((long)a_00 + (long)piVar23);
        psVar32 = (secp256k1_modinv64_signed62 *)
                  ((long)psVar27->v + (ulong)bVar33 + (long)psVar32->v);
        uVar8 = (long)piVar11 * (long)psVar13;
        lVar16 = SUB168(SEXT816((long)piVar11) * SEXT816((long)psVar13),8);
        if (lVar16 < 0) goto LAB_0014292f;
        piVar28 = (int64_t *)(-1 - uVar8);
        lVar15 = ((long)r - lVar16) - (long)psVar24;
        in_RCX = (secp256k1_modinv64_signed62 *)(lVar15 - (ulong)(piVar28 < puVar26));
        a_01 = a_00;
        psVar27 = psVar32;
        if ((SBORROW8((long)r - lVar16,(long)psVar24) != SBORROW8(lVar15,(ulong)(piVar28 < puVar26))
            ) != (long)in_RCX < 0) goto LAB_00142951;
LAB_00142454:
        bVar33 = CARRY8((ulong)puVar26,uVar8);
        puVar26 = puVar26 + uVar8;
        psVar24 = (secp256k1_modinv64_signed62 *)((long)psVar24->v + (ulong)bVar33 + lVar16);
LAB_001424b0:
        uVar8 = (long)psVar27 << 2 | (ulong)a_01 >> 0x3e;
        piVar23 = (int64_t *)(uStack_a0 * lStack_68 + uVar8);
        piVar28 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_68),8) + ((long)psVar27 >> 0x3e)
                  + (ulong)CARRY8(uStack_a0 * lStack_68,uVar8));
        piVar17[1] = (ulong)a_01 & 0x3fffffffffffffff;
        uVar8 = (long)piStack_98 * lStack_48;
        lVar16 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_48),8);
        piStack_88[1] = (ulong)puVar26 & 0x3fffffffffffffff;
        if (lVar16 < 0) {
          uVar9 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
          a_00 = (int64_t *)
                 (((long)piVar28 - uVar9) - (ulong)(piVar23 < (secp256k1_modinv64_signed62 *)-uVar8)
                 );
          if ((SBORROW8((long)piVar28,uVar9) !=
              SBORROW8((long)piVar28 - uVar9,
                       (ulong)(piVar23 < (secp256k1_modinv64_signed62 *)-uVar8))) != (long)a_00 < 0)
          goto LAB_00142586;
LAB_0014251c:
          uVar10 = (ulong)puVar26 >> 0x3e | (long)psVar24 << 2;
          bVar33 = CARRY8((ulong)piVar23,uVar8);
          piVar23 = (int64_t *)((long)piVar23 + uVar8);
          piVar28 = (int64_t *)((long)piVar28 + (ulong)bVar33 + lVar16);
          uVar9 = uStack_b0 * lStack_68 + uVar10;
          a_00 = (int64_t *)
                 (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_68),8) + ((long)psVar24 >> 0x3e)
                 + (ulong)CARRY8(uStack_b0 * lStack_68,uVar10));
          uVar8 = (long)piStack_a8 * lStack_48;
          lVar16 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_48),8);
          if (lVar16 < 0) goto LAB_0014258b;
          uVar10 = (ulong)(-uVar8 - 1 < uVar9);
          lVar15 = ((long)r - lVar16) - (long)a_00;
          bVar33 = SBORROW8((long)r - lVar16,(long)a_00) != SBORROW8(lVar15,uVar10);
          lVar15 = lVar15 - uVar10;
        }
        else {
          a_00 = (int64_t *)(-1 - uVar8);
          lVar15 = ((long)r - lVar16) - (long)piVar28;
          uVar9 = lVar15 - (ulong)(a_00 < piVar23);
          if ((SBORROW8((long)r - lVar16,(long)piVar28) != SBORROW8(lVar15,(ulong)(a_00 < piVar23)))
              == (long)uVar9 < 0) goto LAB_0014251c;
LAB_00142586:
          psStack_b8 = (secp256k1_modinv64_signed62 *)0x14258b;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar8 = extraout_RAX_02;
          lVar16 = extraout_RDX_03;
LAB_0014258b:
          lVar14 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
          lVar15 = (long)a_00 - lVar14;
          bVar33 = SBORROW8((long)a_00,lVar14) != SBORROW8(lVar15,(ulong)(uVar9 < -uVar8));
          lVar15 = lVar15 - (ulong)(uVar9 < -uVar8);
        }
        in_RCX = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar33 != lVar15 < 0) goto LAB_001429cc;
        psVar32 = (secp256k1_modinv64_signed62 *)(uVar9 + uVar8);
        a_00 = (int64_t *)((long)a_00 + (ulong)CARRY8(uVar9,uVar8) + lVar16);
        psVar24 = (secp256k1_modinv64_signed62 *)psStack_90->v[3];
        if (psVar24 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_0014262a;
        piVar11 = (int64_t *)((long)psVar24 * uVar21);
        piVar17 = SUB168(SEXT816((long)psVar24) * SEXT816((long)uVar21),8);
        if ((long)piVar17 < 0) goto LAB_00142956;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar11 - 1U) < piVar23);
        lVar16 = ((long)r - (long)piVar17) - (long)piVar28;
        if ((SBORROW8((long)r - (long)piVar17,(long)piVar28) != SBORROW8(lVar16,uVar8)) !=
            (long)(lVar16 - uVar8) < 0) goto LAB_00142978;
LAB_001425eb:
        bVar33 = CARRY8((ulong)piVar11,(ulong)piVar23);
        piVar11 = (int64_t *)((long)piVar11 + (long)piVar23);
        piVar17 = (int64_t *)((long)piVar17 + (long)piVar28 + (ulong)bVar33);
        uVar8 = (long)psVar24 * (long)psVar13;
        lVar16 = SUB168(SEXT816((long)psVar24) * SEXT816((long)psVar13),8);
        if (lVar16 < 0) goto LAB_0014297d;
        uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar32);
        lVar15 = ((long)r - lVar16) - (long)a_00;
        piVar28 = piVar17;
        piVar23 = piVar11;
        if ((SBORROW8((long)r - lVar16,(long)a_00) != SBORROW8(lVar15,uVar9)) ==
            (long)(lVar15 - uVar9) < 0) {
          do {
            bVar33 = CARRY8((ulong)psVar32,uVar8);
            psVar32 = (secp256k1_modinv64_signed62 *)((long)psVar32->v + uVar8);
            a_00 = (int64_t *)((long)a_00 + (ulong)bVar33 + lVar16);
LAB_0014262a:
            a_01 = piStack_70;
            uVar8 = (long)piVar28 << 2 | (ulong)piVar23 >> 0x3e;
            psVar27 = (secp256k1_modinv64_signed62 *)((ulong)piVar23 & 0x3fffffffffffffff);
            piVar25 = (int64_t *)(uStack_a0 * lStack_78 + uVar8);
            piVar23 = (int64_t *)
                      (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_78),8) +
                       ((long)piVar28 >> 0x3e) + (ulong)CARRY8(uStack_a0 * lStack_78,uVar8));
            piStack_70[2] = (int64_t)psVar27;
            uVar8 = (long)piStack_98 * lStack_80;
            lVar16 = SUB168(SEXT816((long)piStack_98) * SEXT816(lStack_80),8);
            piStack_88[2] = (ulong)psVar32 & 0x3fffffffffffffff;
            if (lVar16 < 0) {
              lVar14 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
              lVar15 = (long)piVar23 - lVar14;
              psVar24 = (secp256k1_modinv64_signed62 *)
                        (lVar15 - (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)piVar23,lVar14) !=
                  SBORROW8(lVar15,(ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                  (long)psVar24 < 0) goto LAB_00142704;
LAB_00142698:
              uVar9 = (ulong)psVar32 >> 0x3e | (long)a_00 << 2;
              bVar33 = CARRY8((ulong)piVar25,uVar8);
              piVar25 = (int64_t *)((long)piVar25 + uVar8);
              piVar23 = (int64_t *)((long)piVar23 + (ulong)bVar33 + lVar16);
              psVar27 = (secp256k1_modinv64_signed62 *)(uStack_b0 * lStack_78 + uVar9);
              psVar24 = (secp256k1_modinv64_signed62 *)
                        (SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_78),8) +
                         ((long)a_00 >> 0x3e) + (ulong)CARRY8(uStack_b0 * lStack_78,uVar9));
              uVar8 = (long)piStack_a8 * lStack_80;
              lVar16 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_80),8);
              if (lVar16 < 0) goto LAB_00142709;
              a_00 = (int64_t *)(-1 - uVar8);
              lVar15 = ((long)r - lVar16) - (long)psVar24;
              bVar33 = SBORROW8((long)r - lVar16,(long)psVar24) !=
                       SBORROW8(lVar15,(ulong)(a_00 < psVar27));
              piVar11 = (int64_t *)(lVar15 - (ulong)(a_00 < psVar27));
            }
            else {
              psVar24 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
              lVar15 = ((long)r - lVar16) - (long)piVar23;
              if ((SBORROW8((long)r - lVar16,(long)piVar23) !=
                  SBORROW8(lVar15,(ulong)(psVar24 < piVar25))) ==
                  (long)(lVar15 - (ulong)(psVar24 < piVar25)) < 0) goto LAB_00142698;
LAB_00142704:
              psStack_b8 = (secp256k1_modinv64_signed62 *)0x142709;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar8 = extraout_RAX_03;
              lVar16 = extraout_RDX_04;
LAB_00142709:
              lVar14 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
              lVar15 = (long)psVar24 - lVar14;
              bVar33 = SBORROW8((long)psVar24,lVar14) !=
                       SBORROW8(lVar15,(ulong)(psVar27 < (secp256k1_modinv64_signed62 *)-uVar8));
              a_00 = (int64_t *)(lVar15 - (ulong)(psVar27 < (secp256k1_modinv64_signed62 *)-uVar8));
              piVar11 = a_00;
            }
            in_RCX = psStack_90;
            piVar17 = (int64_t *)0x8000000000000000;
            if (bVar33 != (long)piVar11 < 0) goto LAB_001429d1;
            piVar11 = (int64_t *)((long)psVar27->v + uVar8);
            psVar27 = (secp256k1_modinv64_signed62 *)
                      ((long)psVar24->v + (ulong)CARRY8((ulong)psVar27,uVar8) + lVar16);
            psVar32 = (secp256k1_modinv64_signed62 *)psStack_90->v[4];
            a_00 = (int64_t *)((long)psVar32 * uVar21);
            uVar21 = SUB168(SEXT816((long)psVar32) * SEXT816((long)uVar21),8);
            if ((long)uVar21 < 0) {
              lVar15 = (-0x8000000000000000 - uVar21) - (ulong)(a_00 != (int64_t *)0x0);
              lVar16 = (long)piVar23 - lVar15;
              if ((SBORROW8((long)piVar23,lVar15) !=
                  SBORROW8(lVar16,(ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)a_00))) !=
                  (long)(lVar16 - (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)a_00)) < 0
                 ) goto LAB_00142895;
LAB_00142764:
              bVar33 = CARRY8((ulong)a_00,(ulong)piVar25);
              a_00 = (int64_t *)((long)a_00 + (long)piVar25);
              uVar21 = (long)piVar23 + bVar33 + uVar21;
              uVar8 = (long)psVar32 * (long)psVar13;
              lVar16 = SUB168(SEXT816((long)psVar32) * SEXT816((long)psVar13),8);
              if (lVar16 < 0) goto LAB_0014289a;
              psVar13 = (secp256k1_modinv64_signed62 *)(-uVar8 - 1);
              lVar15 = (long)r - lVar16;
              lVar14 = lVar15 - (long)psVar27;
              r = (secp256k1_scalar *)(lVar14 - (ulong)(psVar13 < piVar11));
              if ((SBORROW8(lVar15,(long)psVar27) != SBORROW8(lVar14,(ulong)(psVar13 < piVar11))) ==
                  (long)r < 0) goto LAB_00142792;
            }
            else {
              uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a_00 - 1U) < piVar25);
              lVar16 = ((long)r - uVar21) - (long)piVar23;
              if ((SBORROW8((long)r - uVar21,(long)piVar23) != SBORROW8(lVar16,uVar8)) ==
                  (long)(lVar16 - uVar8) < 0) goto LAB_00142764;
LAB_00142895:
              psStack_b8 = (secp256k1_modinv64_signed62 *)0x14289a;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar8 = extraout_RAX_04;
              lVar16 = extraout_RDX_05;
LAB_0014289a:
              piVar23 = (int64_t *)((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
              psVar13 = (secp256k1_modinv64_signed62 *)
                        (((long)psVar27 - (long)piVar23) -
                        (ulong)(piVar11 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)psVar27,(long)piVar23) !=
                  SBORROW8((long)psVar27 - (long)piVar23,
                           (ulong)(piVar11 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                  (long)psVar13 < 0) {
LAB_00142792:
                r = (secp256k1_scalar *)piStack_88;
                lVar16 = (long)psVar27->v + (ulong)CARRY8(uVar8,(ulong)piVar11) + lVar16;
                psVar13 = (secp256k1_modinv64_signed62 *)(uVar21 << 2 | (ulong)a_00 >> 0x3e);
                a_01[3] = (ulong)a_00 & 0x3fffffffffffffff;
                piVar20 = (int64_t *)(uVar8 + (long)piVar11 & 0x3fffffffffffffff);
                piStack_88[3] = (int64_t)piVar20;
                a_00 = psVar13[0x333333333333332].v + 4;
                uVar21 = ((long)uVar21 >> 0x3e) + -1 +
                         (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar13);
                if (uVar21 != 0xffffffffffffffff) goto LAB_001429d6;
                uVar21 = 0xffffffffffffffff;
                uVar8 = uVar8 + (long)piVar11 >> 0x3e | lVar16 * 4;
                a_01[4] = (int64_t)psVar13;
                if ((lVar16 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1)
                goto LAB_001429db;
                piStack_88[4] = uVar8;
                uVar21 = 5;
                psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x14280a;
                a_00 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,in_RCX,-2);
                if (iVar4 < 1) goto LAB_001429e0;
                psVar13 = (secp256k1_modinv64_signed62 *)0x1;
                uVar21 = 5;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x142827;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,in_RCX,1);
                if (-1 < iVar4) goto LAB_001429e5;
                uVar21 = 5;
                psVar13 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x142846;
                a_01 = (int64_t *)r;
                iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
                if (iVar4 < 1) goto LAB_001429ea;
                psVar13 = (secp256k1_modinv64_signed62 *)0x1;
                uVar21 = 5;
                psStack_b8 = (secp256k1_modinv64_signed62 *)0x142863;
                a_01 = (int64_t *)r;
                iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_001429ef;
              }
            }
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1428ba;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_001428ba:
            lVar15 = (-0x8000000000000000 - (long)piVar17) - (ulong)(piVar11 != (int64_t *)0x0);
            lVar16 = (long)piVar23 - lVar15;
            if ((SBORROW8((long)piVar23,lVar15) !=
                SBORROW8(lVar16,(ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)piVar11)))
                == (long)(lVar16 - (ulong)(piVar25 < (secp256k1_modinv64_signed62 *)-(long)piVar11))
                   < 0) goto LAB_00142253;
LAB_001428dc:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x1428e1;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar8 = extraout_RAX_05;
            lVar16 = extraout_RDX_06;
LAB_001428e1:
            puVar26 = (undefined1 *)((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
            psVar24 = (secp256k1_modinv64_signed62 *)
                      (((long)a_00 - (long)puVar26) -
                      (ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8));
            if ((SBORROW8((long)a_00,(long)puVar26) !=
                SBORROW8((long)a_00 - (long)puVar26,
                         (ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                (long)psVar24 < 0) goto LAB_00142284;
LAB_00142903:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x142908;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00142908:
            lVar15 = (-0x8000000000000000 - (long)psVar32) - (ulong)(a_00 != (int64_t *)0x0);
            lVar16 = (long)psVar27 - lVar15;
            piVar23 = a_01;
            if ((SBORROW8((long)psVar27,lVar15) !=
                SBORROW8(lVar16,(ulong)(a_01 < (secp256k1_modinv64_signed62 *)-(long)a_00))) ==
                (long)(lVar16 - (ulong)(a_01 < (secp256k1_modinv64_signed62 *)-(long)a_00)) < 0)
            goto LAB_00142423;
LAB_0014292a:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x14292f;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar8 = extraout_RAX_06;
            lVar16 = extraout_RDX_07;
            piVar23 = a_01;
LAB_0014292f:
            in_RCX = (secp256k1_modinv64_signed62 *)
                     ((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
            piVar28 = (int64_t *)
                      (((long)psVar24 - (long)in_RCX) - (ulong)(puVar26 < (undefined1 *)-uVar8));
            a_01 = a_00;
            psVar27 = psVar32;
            if ((SBORROW8((long)psVar24,(long)in_RCX) !=
                SBORROW8((long)psVar24 - (long)in_RCX,(ulong)(puVar26 < (undefined1 *)-uVar8))) ==
                (long)piVar28 < 0) goto LAB_00142454;
LAB_00142951:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x142956;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_00142956:
            lVar15 = (-0x8000000000000000 - (long)piVar17) - (ulong)(piVar11 != (int64_t *)0x0);
            lVar16 = (long)piVar28 - lVar15;
            if ((SBORROW8((long)piVar28,lVar15) !=
                SBORROW8(lVar16,(ulong)(piVar23 < (secp256k1_modinv64_signed62 *)-(long)piVar11)))
                == (long)(lVar16 - (ulong)(piVar23 < (secp256k1_modinv64_signed62 *)-(long)piVar11))
                   < 0) goto LAB_001425eb;
LAB_00142978:
            psStack_b8 = (secp256k1_modinv64_signed62 *)0x14297d;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar8 = extraout_RAX_07;
            lVar16 = extraout_RDX_08;
LAB_0014297d:
            lVar14 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
            lVar15 = (long)a_00 - lVar14;
            piVar28 = piVar17;
            piVar23 = piVar11;
            if ((SBORROW8((long)a_00,lVar14) !=
                SBORROW8(lVar15,(ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                (long)(lVar15 - (ulong)(psVar32 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0)
            break;
          } while( true );
        }
        psStack_b8 = (secp256k1_modinv64_signed62 *)0x1429a4;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_001429a4;
      }
      lVar22 = (-0x8000000000000000 - (long)a_01) - (ulong)(piVar11 != (int64_t *)0x0);
      lVar14 = (long)a_00 - lVar22;
      if ((SBORROW8((long)a_00,lVar22) !=
          SBORROW8(lVar14,(ulong)(piVar23 < (undefined1 *)-(long)piVar11))) !=
          (long)(lVar14 - (ulong)(piVar23 < (undefined1 *)-(long)piVar11)) < 0) goto LAB_001422a7;
LAB_001420e6:
      psVar32 = (secp256k1_modinv64_signed62 *)((ulong)psVar32 & uStack_b0);
      psVar13 = (secp256k1_modinv64_signed62 *)
                ((long)psVar32 +
                (((ulong)psVar13 & (ulong)piStack_a8) -
                ((long)psVar32->v + uVar8 * (long)piVar25 + ((ulong)psVar13 & (ulong)piStack_a8) &
                0x3fffffffffffffff)));
      bVar33 = CARRY8((ulong)piVar11,(ulong)piVar23);
      piVar11 = (int64_t *)((long)piVar11 + (long)piVar23);
      a_01 = (int64_t *)((long)a_01 + (long)a_00 + (ulong)bVar33);
      uVar8 = (long)psVar13 * lVar16;
      lVar16 = SUB168(SEXT816((long)psVar13) * SEXT816(lVar16),8);
      if (lVar16 < 0) goto LAB_001422ac;
      uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar8 - 1) < piVar25);
      lVar14 = (0x7fffffffffffffff - lVar16) - lVar15;
      if ((SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar14,uVar9)) !=
          (long)(lVar14 - uVar9) < 0) goto LAB_001422ce;
LAB_00142136:
      bVar33 = CARRY8(uVar8,(ulong)piVar25);
      uVar8 = uVar8 + (long)piVar25;
      lVar16 = lVar16 + lVar15 + (ulong)bVar33;
      if (((ulong)piVar11 & 0x3fffffffffffffff) != 0) goto LAB_001429c2;
      in_RCX = psVar32;
      if ((uVar8 & 0x3fffffffffffffff) == 0) {
        uVar9 = (ulong)piVar11 >> 0x3e | (long)a_01 << 2;
        piVar25 = (int64_t *)(uStack_a0 * lStack_58 + uVar9);
        piVar23 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_a0) * SEXT816(lStack_58),8) + ((long)a_01 >> 0x3e) +
                  (ulong)CARRY8(uStack_a0 * lStack_58,uVar9));
        uVar9 = (long)piStack_98 * (long)piStack_40;
        lVar15 = SUB168(SEXT816((long)piStack_98) * SEXT816((long)piStack_40),8);
        a_01 = piStack_40;
        if (lVar15 < 0) goto LAB_001422d3;
        a_00 = (int64_t *)(-1 - uVar9);
        lVar14 = (0x7fffffffffffffff - lVar15) - (long)piVar23;
        psVar32 = (secp256k1_modinv64_signed62 *)(lVar14 - (ulong)(a_00 < piVar25));
        if ((SBORROW8(0x7fffffffffffffff - lVar15,(long)piVar23) !=
            SBORROW8(lVar14,(ulong)(a_00 < piVar25))) != (long)psVar32 < 0) goto LAB_001422f8;
        goto LAB_001421b9;
      }
      goto LAB_001429c7;
    }
  }
  iVar4 = (int)uVar21;
  psStack_b8 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar27 = &sStack_118;
  piStack_c8 = piVar20;
  piStack_c0 = (int64_t *)r;
  psStack_b8 = in_RCX;
  secp256k1_modinv64_mul_62(&sStack_f0,(secp256k1_modinv64_signed62 *)a_00,iVar4,1);
  psVar32 = a_02;
  secp256k1_modinv64_mul_62(&sStack_118,a_02,5,(int64_t)psVar13);
  lVar16 = 0;
  while ((ulong)sStack_f0.v[lVar16] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_118.v[lVar16]) goto LAB_00142a8e;
    lVar16 = lVar16 + 1;
    if (lVar16 == 4) {
      uVar5 = 4;
      while( true ) {
        if (sStack_f0.v[uVar5] < sStack_118.v[uVar5]) {
          return;
        }
        if (sStack_118.v[uVar5] < sStack_f0.v[uVar5]) break;
        bVar33 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar33) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142a8e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar27;
  if (iVar4 < 1) {
LAB_00142d3b:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00142d40:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00142d45:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00142d4a:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00142d4f:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00142d54:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar16 = psVar13->v[0];
    lVar15 = psVar13->v[1];
    lVar14 = psVar32->v[0];
    lVar22 = *extraout_RDX_09;
    uVar21 = lVar14 * lVar16;
    lVar18 = SUB168(SEXT816(lVar14) * SEXT816(lVar16),8);
    uVar8 = lVar22 * lVar15;
    lVar19 = SUB168(SEXT816(lVar22) * SEXT816(lVar15),8);
    lVar2 = (0x7fffffffffffffff - lVar19) - lVar18;
    if ((SBORROW8(0x7fffffffffffffff - lVar19,lVar18) != SBORROW8(lVar2,(ulong)(~uVar8 < uVar21)))
        != (long)(lVar2 - (ulong)(~uVar8 < uVar21)) < 0 && -1 < lVar19) goto LAB_00142d54;
    lVar2 = psVar13->v[2];
    lVar1 = psVar13->v[3];
    lVar19 = lVar19 + lVar18 + (ulong)CARRY8(uVar8,uVar21);
    uVar10 = lVar14 * lVar2;
    lVar18 = SUB168(SEXT816(lVar14) * SEXT816(lVar2),8);
    uVar12 = lVar22 * lVar1;
    lVar22 = SUB168(SEXT816(lVar22) * SEXT816(lVar1),8);
    uVar9 = (ulong)(-uVar12 - 1 < uVar10);
    lVar14 = (0x7fffffffffffffff - lVar22) - lVar18;
    if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar18) != SBORROW8(lVar14,uVar9)) ==
        (long)(lVar14 - uVar9) < 0 || lVar22 < 0) {
      lVar14 = lVar22 + lVar18 + (ulong)CARRY8(uVar12,uVar10);
      if ((uVar8 + uVar21 & 0x3fffffffffffffff) != 0) goto LAB_00142d40;
      if ((uVar12 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_00142d45;
      uVar9 = uVar12 + uVar10 >> 0x3e | lVar14 * 4;
      uVar21 = uVar8 + uVar21 >> 0x3e | lVar19 * 4;
      lVar14 = lVar14 >> 0x3e;
      lVar19 = lVar19 >> 0x3e;
      if (iVar4 != 1) {
        psVar27 = (secp256k1_modinv64_signed62 *)((ulong)psVar27 & 0xffffffff);
        psVar13 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar22 = psVar32->v[(long)psVar13];
          uVar10 = lVar22 * lVar16 + uVar21;
          lVar29 = SUB168(SEXT816(lVar22) * SEXT816(lVar16),8) + lVar19 +
                   (ulong)CARRY8(lVar22 * lVar16,uVar21);
          lVar18 = extraout_RDX_09[(long)psVar13];
          uVar8 = lVar18 * lVar15;
          lVar19 = SUB168(SEXT816(lVar18) * SEXT816(lVar15),8);
          if (lVar19 < 0) {
            lVar30 = (-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0);
            lVar3 = lVar29 - lVar30;
            if ((SBORROW8(lVar29,lVar30) != SBORROW8(lVar3,(ulong)(uVar10 < -uVar8))) ==
                (long)(lVar3 - (ulong)(uVar10 < -uVar8)) < 0) goto LAB_00142c2a;
LAB_00142d31:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00142d36:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00142d3b;
          }
          uVar21 = (ulong)(-uVar8 - 1 < uVar10);
          lVar3 = (0x7fffffffffffffff - lVar19) - lVar29;
          if ((SBORROW8(0x7fffffffffffffff - lVar19,lVar29) != SBORROW8(lVar3,uVar21)) !=
              (long)(lVar3 - uVar21) < 0) goto LAB_00142d31;
LAB_00142c2a:
          lVar19 = lVar29 + lVar19 + (ulong)CARRY8(uVar10,uVar8);
          uVar31 = lVar22 * lVar2 + uVar9;
          lVar22 = SUB168(SEXT816(lVar22) * SEXT816(lVar2),8) + lVar14 +
                   (ulong)CARRY8(lVar22 * lVar2,uVar9);
          uVar12 = lVar18 * lVar1;
          lVar14 = SUB168(SEXT816(lVar18) * SEXT816(lVar1),8);
          if (lVar14 < 0) {
            lVar29 = (-0x8000000000000000 - lVar14) - (ulong)(uVar12 != 0);
            lVar18 = lVar22 - lVar29;
            if ((SBORROW8(lVar22,lVar29) != SBORROW8(lVar18,(ulong)(uVar31 < -uVar12))) !=
                (long)(lVar18 - (ulong)(uVar31 < -uVar12)) < 0) goto LAB_00142d36;
          }
          else {
            uVar21 = (ulong)(-uVar12 - 1 < uVar31);
            lVar18 = (0x7fffffffffffffff - lVar14) - lVar22;
            if ((SBORROW8(0x7fffffffffffffff - lVar14,lVar22) != SBORROW8(lVar18,uVar21)) !=
                (long)(lVar18 - uVar21) < 0) goto LAB_00142d36;
          }
          lVar14 = lVar22 + lVar14 + (ulong)CARRY8(uVar31,uVar12);
          uVar21 = lVar19 * 4 | uVar10 + uVar8 >> 0x3e;
          psVar32->v[(long)((long)psVar13[-1].v + 0x27)] = uVar10 + uVar8 & 0x3fffffffffffffff;
          uVar9 = lVar14 * 4 | uVar31 + uVar12 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar13[-1].v + 0x27)] = uVar31 + uVar12 & 0x3fffffffffffffff
          ;
          psVar13 = (secp256k1_modinv64_signed62 *)((long)psVar13->v + 1);
          lVar14 = lVar14 >> 0x3e;
          lVar19 = lVar19 >> 0x3e;
        } while (psVar27 != psVar13);
      }
      if (lVar19 + -1 + (ulong)(0x7fffffffffffffff < uVar21) != -1) goto LAB_00142d4a;
      psVar32->v[(long)iVar4 + -1] = uVar21;
      if (lVar14 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_00142d4f;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar16 = psVar27->v[0];
  lVar15 = psVar27->v[1];
  lVar14 = psVar27->v[2];
  lVar22 = psVar27->v[3];
  lVar2 = psVar27->v[4];
  lVar18 = 0;
  do {
    if (psVar27->v[lVar18] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00142f8a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00142f8f;
    }
    if (0x3fffffffffffffff < psVar27->v[lVar18]) goto LAB_00142f8a;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar27,5,b,-2);
  if (iVar4 < 1) {
LAB_00142f8f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00142f94:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142f99:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar27,5,b,1);
    if (-1 < iVar4) goto LAB_00142f94;
    uVar21 = lVar2 >> 0x3f;
    uVar10 = (long)psVar32 >> 0x3f;
    uVar8 = ((uVar21 & b->v[0]) + lVar16 ^ uVar10) - uVar10;
    uVar12 = ((long)uVar8 >> 0x3e) + (((uVar21 & b->v[1]) + lVar15 ^ uVar10) - uVar10);
    uVar31 = ((long)uVar12 >> 0x3e) + ((lVar14 + (uVar21 & b->v[2]) ^ uVar10) - uVar10);
    uVar9 = ((long)uVar31 >> 0x3e) + (((uVar21 & b->v[3]) + lVar22 ^ uVar10) - uVar10);
    lVar16 = ((long)uVar9 >> 0x3e) + (((uVar21 & b->v[4]) + lVar2 ^ uVar10) - uVar10);
    uVar10 = lVar16 >> 0x3f;
    uVar21 = (b->v[0] & uVar10) + (uVar8 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar21 >> 0x3e) + (b->v[1] & uVar10) + (uVar12 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar12 >> 0x3e) + (b->v[2] & uVar10) + (uVar31 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (b->v[3] & uVar10) + (uVar9 & 0x3fffffffffffffff);
    uVar10 = (b->v[4] & uVar10) + lVar16 + ((long)uVar9 >> 0x3e);
    psVar27->v[0] = uVar21 & 0x3fffffffffffffff;
    psVar27->v[1] = uVar12 & 0x3fffffffffffffff;
    psVar27->v[2] = uVar8 & 0x3fffffffffffffff;
    psVar27->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar27->v[4] = uVar10;
    if (0x3fffffffffffffff < uVar10) goto LAB_00142f99;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar27,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar27,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00142fa3;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00142fa3:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_from_signed62(secp256k1_scalar *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->d[0] = a0      | a1 << 62;
    r->d[1] = a1 >> 2 | a2 << 60;
    r->d[2] = a2 >> 4 | a3 << 58;
    r->d[3] = a3 >> 6 | a4 << 56;

    SECP256K1_SCALAR_VERIFY(r);
}